

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonObjectStep(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  JsonString *p;
  char *__s;
  size_t sVar2;
  u32 N;
  
  if ((short)ctx->pMem->flags < 0) {
    p = (JsonString *)ctx->pMem->z;
  }
  else {
    p = (JsonString *)createAggContext(ctx,0x88);
  }
  if (p != (JsonString *)0x0) {
    if (p->zBuf == (char *)0x0) {
      p->eErr = '\0';
      p->zSpace[0] = '{';
      p->zBuf = p->zSpace;
      p->nAlloc = 100;
      p->bStatic = '\x01';
      p->nUsed = 1;
    }
    else {
      uVar1 = p->nUsed;
      if (1 < uVar1) {
        if (uVar1 < p->nAlloc) {
          p->nUsed = uVar1 + 1;
          p->zBuf[uVar1] = ',';
        }
        else {
          jsonAppendCharExpand(p,',');
        }
      }
    }
    p->pCtx = ctx;
    __s = (char *)sqlite3ValueText(*argv,'\x01');
    if (__s == (char *)0x0) {
      N = 0;
    }
    else {
      sVar2 = strlen(__s);
      N = (uint)sVar2 & 0x3fffffff;
    }
    jsonAppendString(p,__s,N);
    uVar1 = p->nUsed;
    if (uVar1 < p->nAlloc) {
      p->nUsed = uVar1 + 1;
      p->zBuf[uVar1] = ':';
    }
    else {
      jsonAppendCharExpand(p,':');
    }
    jsonAppendSqlValue(p,argv[1]);
    return;
  }
  return;
}

Assistant:

static void jsonObjectStep(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString *pStr;
  const char *z;
  u32 n;
  UNUSED_PARAMETER(argc);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, sizeof(*pStr));
  if( pStr ){
    if( pStr->zBuf==0 ){
      jsonStringInit(pStr, ctx);
      jsonAppendChar(pStr, '{');
    }else if( pStr->nUsed>1 ){
      jsonAppendChar(pStr, ',');
    }
    pStr->pCtx = ctx;
    z = (const char*)sqlite3_value_text(argv[0]);
    n = sqlite3Strlen30(z);
    jsonAppendString(pStr, z, n);
    jsonAppendChar(pStr, ':');
    jsonAppendSqlValue(pStr, argv[1]);
  }
}